

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocatorFactory.cpp
# Opt level: O1

FUNCTION_RETURN
license::locate::LocatorFactory::get_active_strategies
          (vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
           *strategies,LicenseLocation *locationHint)

{
  EnvironmentVarData *pEVar1;
  LocatorStrategy *this;
  ExternalDefinition *this_00;
  _Head_base<0UL,_license::locate::LocatorStrategy_*,_false> local_20;
  
  if (find_license_near_moduleb == '\x01') {
    pEVar1 = (EnvironmentVarData *)operator_new(0x28);
    ApplicationFolder::ApplicationFolder((ApplicationFolder *)pEVar1);
    local_20._M_head_impl = (LocatorStrategy *)pEVar1;
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
    ::
    emplace_back<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>
              ((vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
                *)strategies,
               (unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                *)&local_20);
    if ((EnvironmentVarData *)local_20._M_head_impl != (EnvironmentVarData *)0x0) {
      (*((LocatorStrategy *)&(local_20._M_head_impl)->_vptr_LocatorStrategy)->_vptr_LocatorStrategy
        [4])();
    }
  }
  if (find_license_with_env_varb == '\x01') {
    this = (LocatorStrategy *)operator_new(0x28);
    EnvironmentVarLocation::EnvironmentVarLocation((EnvironmentVarLocation *)this);
    local_20._M_head_impl = this;
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
    ::
    emplace_back<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>
              ((vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
                *)strategies,
               (unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                *)&local_20);
    if (local_20._M_head_impl != (LocatorStrategy *)0x0) {
      (*((LocatorStrategy *)&(local_20._M_head_impl)->_vptr_LocatorStrategy)->_vptr_LocatorStrategy
        [4])();
    }
    pEVar1 = (EnvironmentVarData *)operator_new(0x30);
    EnvironmentVarData::EnvironmentVarData(pEVar1);
    local_20._M_head_impl = (LocatorStrategy *)pEVar1;
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
    ::
    emplace_back<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>
              ((vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
                *)strategies,
               (unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                *)&local_20);
    if ((EnvironmentVarData *)local_20._M_head_impl != (EnvironmentVarData *)0x0) {
      (*((LocatorStrategy *)&(local_20._M_head_impl)->_vptr_LocatorStrategy)->_vptr_LocatorStrategy
        [4])();
    }
  }
  if (locationHint != (LicenseLocation *)0x0) {
    this_00 = (ExternalDefinition *)operator_new(0x30);
    ExternalDefinition::ExternalDefinition(this_00,locationHint);
    local_20._M_head_impl = (LocatorStrategy *)this_00;
    std::
    vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
    ::
    emplace_back<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>
              ((vector<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>,std::allocator<std::unique_ptr<license::locate::LocatorStrategy,std::default_delete<license::locate::LocatorStrategy>>>>
                *)strategies,
               (unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                *)&local_20);
    if ((ExternalDefinition *)local_20._M_head_impl != (ExternalDefinition *)0x0) {
      (*((LocatorStrategy *)&(local_20._M_head_impl)->_vptr_LocatorStrategy)->_vptr_LocatorStrategy
        [4])();
    }
  }
  return (FUNCTION_RETURN)
         ((strategies->
          super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish ==
         (strategies->
         super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

FUNCTION_RETURN LocatorFactory::get_active_strategies(std::vector<std::unique_ptr<LocatorStrategy>> &strategies,
													  const LicenseLocation *locationHint) {
	if (find_license_near_moduleb) {
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new ApplicationFolder())));
	}
	if (find_license_with_env_varb) {
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new EnvironmentVarLocation())));
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new EnvironmentVarData())));
	}
	if (locationHint != nullptr) {
		strategies.push_back(
			std::unique_ptr<LocatorStrategy>(dynamic_cast<LocatorStrategy *>(new ExternalDefinition(locationHint))));
	}
	return strategies.size() > 0 ? FUNC_RET_OK : FUNC_RET_NOT_AVAIL;
}